

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderProgramInterfaces.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderProgramInterfaces::verifyPropertyValue
          (TessellationShaderProgramInterfaces *this,GLenum interface,GLenum property,GLuint index,
          GLint expected_value)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestError *this_00;
  int local_2c;
  long lStack_28;
  GLint property_value;
  Functions *gl;
  GLint expected_value_local;
  GLuint index_local;
  GLenum property_local;
  GLenum interface_local;
  TessellationShaderProgramInterfaces *this_local;
  
  gl._0_4_ = expected_value;
  gl._4_4_ = index;
  expected_value_local = property;
  index_local = interface;
  _property_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  local_2c = 0;
  (**(code **)(lStack_28 + 0x9c8))
            (this->m_po_id,index_local,gl._4_4_,1,&expected_value_local,1,0,&local_2c);
  err = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(err,"glGetProgramResourceiv() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                  ,0x23f);
  if (local_2c != (GLint)gl) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid GL_REFERENCED_BY_... property value reported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
               ,0x243);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void TessellationShaderProgramInterfaces::verifyPropertyValue(glw::GLenum interface, glw::GLenum property,
															  glw::GLuint index, glw::GLint expected_value)
{
	const glw::Functions& gl			 = m_context.getRenderContext().getFunctions();
	glw::GLint			  property_value = 0;

	gl.getProgramResourceiv(m_po_id, interface, index, 1, /* propCount */
							&property, 1,				  /* bufSize */
							NULL,						  /* length */
							&property_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceiv() failed");

	if (property_value != expected_value)
	{
		TCU_FAIL("Invalid GL_REFERENCED_BY_... property value reported");
	}
}